

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook.c
# Opt level: O0

void hook_invoke_alloc(hook_alloc_t type,void *result,uintptr_t result_raw,uintptr_t *args_raw)

{
  _Bool _Var1;
  _Bool *p_Var2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined4 in_EDI;
  seq_hooks_t *unaff_retaddr;
  hooks_internal_t *in_stack_00000008;
  hook_alloc h;
  _Bool for_each_hook_success;
  int for_each_hook_counter;
  hooks_internal_t hook;
  _Bool *in_hook;
  uint result_1;
  int iStack_6c;
  code *pcStack_68;
  undefined8 uStack_50;
  byte bStack_48;
  
  if ((nhooks.repr != 0) && (p_Var2 = hook_reentrantp(), (*p_Var2 & 1U) == 0)) {
    *p_Var2 = true;
    for (iStack_6c = 0; iStack_6c < 4; iStack_6c = iStack_6c + 1) {
      _Var1 = seq_try_load_hooks(in_stack_00000008,unaff_retaddr);
      if (((_Var1) && ((bStack_48 & 1) != 0)) && (pcStack_68 != (code *)0x0)) {
        (*pcStack_68)(uStack_50,in_EDI,in_RSI,in_RDX,in_RCX);
      }
    }
    *p_Var2 = false;
  }
  return;
}

Assistant:

void
hook_invoke_alloc(hook_alloc_t type, void *result, uintptr_t result_raw,
    uintptr_t args_raw[3]) {
	HOOK_PROLOGUE

	hooks_internal_t hook;
	FOR_EACH_HOOK_BEGIN(&hook)
		hook_alloc h = hook.hooks.alloc_hook;
		if (h != NULL) {
			h(hook.hooks.extra, type, result, result_raw, args_raw);
		}
	FOR_EACH_HOOK_END

	HOOK_EPILOGUE
}